

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O0

void __thiscall dxil_spv::Converter::Impl::rewrite_value(Impl *this,Value *value,Id id)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false> local_30;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false> local_28;
  iterator value_itr;
  Value *pVStack_18;
  Id id_local;
  Value *value_local;
  Impl *this_local;
  
  value_itr.super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
  _M_cur._4_4_ = id;
  pVStack_18 = value;
  value_local = (Value *)this;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
       ::find(&this->value_map,&stack0xffffffffffffffe8);
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
       ::end(&this->value_map);
  bVar3 = std::__detail::operator!=(&local_28,&local_30);
  uVar1 = value_itr.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
          _M_cur._4_4_;
  if (bVar3) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>::
             operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>
                         *)&local_28);
    uVar1 = value_itr.
            super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
            _M_cur._4_4_;
    if (ppVar4->second !=
        value_itr.
        super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>._M_cur
        ._4_4_) {
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>
                           *)&local_28);
      pmVar5 = std::
               unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
               ::operator[](&this->phi_incoming_rewrite,&ppVar4->second);
      uVar2 = value_itr.
              super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false>.
              _M_cur._4_4_;
      *pmVar5 = uVar1;
      ppVar4 = std::__detail::
               _Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>::
               operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>,_false,_false>
                           *)&local_28);
      ppVar4->second = uVar2;
    }
  }
  else {
    pmVar6 = std::
             unordered_map<const_LLVMBC::Value_*,_unsigned_int,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_unsigned_int>_>_>
             ::operator[](&this->value_map,&stack0xffffffffffffffe8);
    *pmVar6 = uVar1;
  }
  return;
}

Assistant:

void Converter::Impl::rewrite_value(const llvm::Value *value, spv::Id id)
{
	auto value_itr = value_map.find(value);
	if (value_itr != value_map.end())
	{
		if (value_itr->second != id)
		{
			// If a PHI node previously accessed the value ID map, it will now refer to a dead
			// ID. Remember to rewrite PHI incoming nodes as necessary.
			phi_incoming_rewrite[value_itr->second] = id;
			value_itr->second = id;
		}
	}
	else
		value_map[value] = id;
}